

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O0

unsigned_long Read<unsigned_long>(IOStream *stream)

{
  int iVar1;
  undefined4 extraout_var;
  DeadlyImportError *this;
  allocator<char> local_41;
  string local_40;
  long local_20;
  size_t res;
  unsigned_long t;
  IOStream *stream_local;
  
  t = (unsigned_long)stream;
  iVar1 = (*stream->_vptr_IOStream[2])(stream,&res,8,1);
  local_20 = CONCAT44(extraout_var,iVar1);
  if (local_20 != 1) {
    this = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Unexpected EOF",&local_41);
    DeadlyImportError::DeadlyImportError(this,&local_40);
    __cxa_throw(this,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  return res;
}

Assistant:

T Read(IOStream * stream) {
    T t;
    size_t res = stream->Read( &t, sizeof(T), 1 );
    if(res != 1)
        throw DeadlyImportError("Unexpected EOF");
    return t;
}